

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeanLoader.h
# Opt level: O3

int __thiscall hiberlite::LoadBean::locateCol(LoadBean *this,string *name)

{
  _Alloc_hider _Var1;
  int iVar2;
  int iVar3;
  runtime_error *this_00;
  _Elt_pointer ppVar4;
  int N;
  bool bVar5;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  ppVar4 = (this->stmt).c.
           super__Deque_base<std::pair<hiberlite::SQLiteSelect,_long_long>,_std::allocator<std::pair<hiberlite::SQLiteSelect,_long_long>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppVar4 == (this->stmt).c.
                super__Deque_base<std::pair<hiberlite::SQLiteSelect,_long_long>,_std::allocator<std::pair<hiberlite::SQLiteSelect,_long_long>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_first) {
    ppVar4 = (this->stmt).c.
             super__Deque_base<std::pair<hiberlite::SQLiteSelect,_long_long>,_std::allocator<std::pair<hiberlite::SQLiteSelect,_long_long>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 9;
  }
  iVar2 = SQLiteSelect::column_count(&ppVar4[-1].first);
  if (iVar2 != 0) {
    N = 0;
    do {
      SQLiteSelect::get_name_abi_cxx11_(&local_70,&ppVar4[-1].first,N);
      _Var1._M_p = local_70._M_dataplus._M_p;
      if (local_70._M_string_length == name->_M_string_length) {
        if (local_70._M_string_length == 0) {
          bVar5 = true;
        }
        else {
          iVar3 = bcmp(local_70._M_dataplus._M_p,(name->_M_dataplus)._M_p,local_70._M_string_length)
          ;
          bVar5 = iVar3 == 0;
        }
      }
      else {
        bVar5 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var1._M_p != &local_70.field_2) {
        operator_delete(_Var1._M_p);
      }
      if (bVar5) {
        return N;
      }
      N = N + 1;
    } while (iVar2 != N);
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_50,name,": column not found in SELECT query results");
  std::runtime_error::runtime_error(this_00,(string *)&local_50);
  *(undefined ***)this_00 = &PTR__runtime_error_001d36a8;
  __cxa_throw(this_00,&database_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline int locateCol(std::string name){
			SQLiteSelect& sel=stmt.top().first;
			unsigned int n=sel.column_count();
			for(unsigned int i=0;i<n;i++)
			if(sel.get_name(i)==name)
				return i;
			throw database_error(name+": column not found in SELECT query results");
		}